

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O1

cgltf_size cgltf_num_components(cgltf_type type)

{
  cgltf_size cVar1;
  
  cVar1 = 1;
  if (type - cgltf_type_vec2 < 6) {
    cVar1 = *(cgltf_size *)(&DAT_0011e178 + (ulong)(type - cgltf_type_vec2) * 8);
  }
  return cVar1;
}

Assistant:

cgltf_size cgltf_num_components(cgltf_type type) {
	switch (type)
	{
	case cgltf_type_vec2:
		return 2;
	case cgltf_type_vec3:
		return 3;
	case cgltf_type_vec4:
		return 4;
	case cgltf_type_mat2:
		return 4;
	case cgltf_type_mat3:
		return 9;
	case cgltf_type_mat4:
		return 16;
	case cgltf_type_invalid:
	case cgltf_type_scalar:
	default:
		return 1;
	}
}